

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O1

Abc_Ntk_t *
Abc_NtkMap(Abc_Ntk_t *pNtk,double DelayTarget,double AreaMulti,double DelayMulti,float LogFan,
          float Slew,float Gain,int nGatesMin,int fRecovery,int fSwitching,int fSkipFanout,
          int fUseProfile,int fUseBuffs,int fVerbose)

{
  float *pSwitching;
  int iVar1;
  Mio_Library_t *pLib;
  void *pvVar2;
  Mio_Library_t *pMVar3;
  Map_SuperLib_t *p;
  char *pcVar4;
  char *pcVar5;
  Vec_Int_t *__ptr;
  Map_Man_t *p_00;
  Abc_Ntk_t *pNtkNew;
  Map_Node_t **ppMVar6;
  Map_Node_t *pMVar7;
  Abc_Obj_t *pAVar8;
  Vec_Ptr_t *pVVar9;
  Abc_Ntk_t *pAVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int level;
  Abc_Ntk_t *pNtk_00;
  timespec ts;
  timespec local_40;
  
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMap.c"
                  ,0x48,
                  "Abc_Ntk_t *Abc_NtkMap(Abc_Ntk_t *, double, double, double, float, float, float, int, int, int, int, int, int, int)"
                 );
  }
  pvVar2 = Abc_FrameReadLibScl();
  if (pvVar2 != (void *)0x0) {
    pvVar2 = Abc_FrameReadLibScl();
    iVar1 = Abc_SclHasDelayInfo(pvVar2);
    if (iVar1 != 0) {
      if ((pLib == (Mio_Library_t *)0x0) || (iVar1 = Mio_LibraryHasProfile(pLib), iVar1 == 0)) {
        pvVar2 = Abc_FrameReadLibScl();
        pLib = (Mio_Library_t *)0x0;
      }
      else {
        pvVar2 = Abc_FrameReadLibScl();
      }
      pLib = Abc_SclDeriveGenlib(pvVar2,pLib,Slew,Gain,nGatesMin,fVerbose);
      pvVar2 = Abc_FrameReadLibGen();
      if (pvVar2 != (void *)0x0) {
        pMVar3 = (Mio_Library_t *)Abc_FrameReadLibGen();
        Mio_LibraryTransferDelays(pMVar3,pLib);
        pMVar3 = (Mio_Library_t *)Abc_FrameReadLibGen();
        Mio_LibraryTransferProfile(pLib,pMVar3);
      }
      p = (Map_SuperLib_t *)Abc_FrameReadLibSuper();
      Map_SuperLibFree(p);
      Abc_FrameSetLibSuper((void *)0x0);
    }
  }
  if (pLib == (Mio_Library_t *)0x0) {
    puts("The current library is not available.");
  }
  else {
    if ((AreaMulti != 0.0) || (NAN(AreaMulti))) {
      Abc_NtkMap_fUseMulti = '\x01';
      printf("The cell areas are multiplied by the factor: <num_fanins> ^ (%.2f).\n");
    }
    if ((DelayMulti != 0.0) || (NAN(DelayMulti))) {
      Abc_NtkMap_fUseMulti = '\x01';
      printf("The cell delays are multiplied by the factor: <num_fanins> ^ (%.2f).\n",DelayMulti);
    }
    if ((AreaMulti != 0.0) || (NAN(AreaMulti))) {
      Mio_LibraryMultiArea(pLib,AreaMulti);
    }
    if ((DelayMulti != 0.0) || (NAN(DelayMulti))) {
      Mio_LibraryMultiDelay(pLib,DelayMulti);
    }
    if ((Abc_NtkMap_fUseMulti != '\0') || (pvVar2 = Abc_FrameReadLibSuper(), pvVar2 == (void *)0x0))
    {
      if (fVerbose != 0) {
        pcVar4 = Mio_LibraryReadName(pLib);
        pcVar5 = Mio_LibraryReadName(pLib);
        pcVar5 = Extra_FileNameGenericAppend(pcVar5,".super");
        printf("Converting \"%s\" into supergate library \"%s\".\n",pcVar4,pcVar5);
      }
      iVar1 = Mio_LibraryHasProfile(pLib);
      if (iVar1 != 0) {
        puts("Abc_NtkMap(): Genlib library has profile.");
      }
      Map_SuperLibDeriveFromGenlib(pLib,fVerbose);
    }
    if ((AreaMulti != 0.0) || (NAN(AreaMulti))) {
      pMVar3 = (Mio_Library_t *)Abc_FrameReadLibGen();
      Mio_LibraryMultiArea(pMVar3,-AreaMulti);
    }
    if ((DelayMulti != 0.0) || (NAN(DelayMulti))) {
      pMVar3 = (Mio_Library_t *)Abc_FrameReadLibGen();
      Mio_LibraryMultiDelay(pMVar3,-DelayMulti);
    }
    if ((fVerbose != 0) && (iVar1 = Abc_NtkGetChoiceNum(pNtk), iVar1 != 0)) {
      puts("Performing mapping with choices.");
    }
    __ptr = Sim_NtkComputeSwitching(pNtk,0x1000);
    pSwitching = (float *)__ptr->pArray;
    p_00 = Abc_NtkToMap(pNtk,DelayTarget,fRecovery,pSwitching,fVerbose);
    if (pSwitching != (float *)0x0) {
      if (__ptr->pArray != (int *)0x0) {
        free(__ptr->pArray);
        __ptr->pArray = (int *)0x0;
      }
      if (__ptr != (Vec_Int_t *)0x0) {
        free(__ptr);
      }
    }
    if (p_00 != (Map_Man_t *)0x0) {
      clock_gettime(3,&local_40);
      Map_ManSetSwitching(p_00,fSwitching);
      Map_ManSetSkipFanout(p_00,fSkipFanout);
      if (fUseProfile != 0) {
        Map_ManSetUseProfile(p_00);
      }
      if ((LogFan != 0.0) || (NAN(LogFan))) {
        Map_ManCreateNodeDelays(p_00,(int)LogFan);
      }
      iVar1 = Map_Mapping(p_00);
      if (iVar1 == 0) {
        Map_ManFree(p_00);
      }
      else {
        iVar1 = Map_ManReadBufNum(p_00);
        if (iVar1 != pNtk->nBarBufs) {
          __assert_fail("Map_ManReadBufNum(pMan) == pNtk->nBarBufs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMap.c"
                        ,0x1dd,"Abc_Ntk_t *Abc_NtkFromMap(Map_Man_t *, Abc_Ntk_t *, int)");
        }
        pNtkNew = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_MAP);
        Map_ManCleanData(p_00);
        pVVar9 = pNtk->vCis;
        uVar11 = (ulong)(uint)pVVar9->nSize;
        if (0 < pVVar9->nSize) {
          lVar13 = 0;
          do {
            if ((long)(int)uVar11 - (long)pNtk->nBarBufs <= lVar13) break;
            pvVar2 = pVVar9->pArray[lVar13];
            ppMVar6 = Map_ManReadInputs(p_00);
            Map_NodeSetData(ppMVar6[lVar13],1,*(char **)((long)pvVar2 + 0x40));
            lVar13 = lVar13 + 1;
            pVVar9 = pNtk->vCis;
            uVar11 = (ulong)pVVar9->nSize;
          } while (lVar13 < (long)uVar11);
        }
        pVVar9 = pNtk->vCis;
        uVar11 = (ulong)(uint)pVVar9->nSize;
        if (0 < pVVar9->nSize) {
          lVar13 = 0;
          do {
            if ((long)(int)uVar11 - (long)pNtk->nBarBufs <= lVar13) {
              pvVar2 = pVVar9->pArray[lVar13];
              ppMVar6 = Map_ManReadBufs(p_00);
              Map_NodeSetData(ppMVar6[(pNtk->nBarBufs - pNtk->vCis->nSize) + (int)lVar13],1,
                              *(char **)((long)pvVar2 + 0x40));
            }
            lVar13 = lVar13 + 1;
            pVVar9 = pNtk->vCis;
            uVar11 = (ulong)pVVar9->nSize;
          } while (lVar13 < (long)uVar11);
        }
        pVVar9 = pNtk->vCos;
        uVar11 = (ulong)(uint)pVVar9->nSize;
        if (0 < pVVar9->nSize) {
          lVar13 = 0;
          do {
            if ((int)uVar11 - pNtk->nBarBufs <= lVar13) {
              pvVar2 = pVVar9->pArray[lVar13];
              pMVar7 = Map_ManReadBufDriver(p_00,(pNtk->nBarBufs - (int)uVar11) + (int)lVar13);
              pAVar8 = Abc_NodeFromMap_rec(pNtkNew,(Map_Node_t *)
                                                   ((ulong)pMVar7 & 0xfffffffffffffffe),
                                           ~(uint)pMVar7 & 1);
              if (((ulong)pAVar8 & 1) != 0) {
                __assert_fail("!Abc_ObjIsComplement(pNodeNew)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMap.c"
                              ,0x1f5,"Abc_Ntk_t *Abc_NtkFromMap(Map_Man_t *, Abc_Ntk_t *, int)");
              }
              Abc_ObjAddFanin(*(Abc_Obj_t **)((long)pvVar2 + 0x40),pAVar8);
            }
            lVar13 = lVar13 + 1;
            pVVar9 = pNtk->vCos;
            uVar11 = (ulong)pVVar9->nSize;
          } while (lVar13 < (long)uVar11);
        }
        pVVar9 = pNtk->vCos;
        uVar11 = (ulong)(uint)pVVar9->nSize;
        if (0 < pVVar9->nSize) {
          lVar13 = 0;
          do {
            if ((long)(int)uVar11 - (long)pNtk->nBarBufs <= lVar13) break;
            pvVar2 = pVVar9->pArray[lVar13];
            ppMVar6 = Map_ManReadOutputs(p_00);
            pAVar8 = Abc_NodeFromMap_rec(pNtkNew,(Map_Node_t *)
                                                 ((ulong)ppMVar6[lVar13] & 0xfffffffffffffffe),
                                         ~(uint)ppMVar6[lVar13] & 1);
            if (((ulong)pAVar8 & 1) != 0) {
              __assert_fail("!Abc_ObjIsComplement(pNodeNew)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMap.c"
                            ,0x1fe,"Abc_Ntk_t *Abc_NtkFromMap(Map_Man_t *, Abc_Ntk_t *, int)");
            }
            Abc_ObjAddFanin(*(Abc_Obj_t **)((long)pvVar2 + 0x40),pAVar8);
            lVar13 = lVar13 + 1;
            pVVar9 = pNtk->vCos;
            uVar11 = (ulong)pVVar9->nSize;
          } while (lVar13 < (long)uVar11);
        }
        Abc_NtkLogicMakeSimpleCos(pNtkNew,(uint)(DelayTarget != 1000000000.0 && fUseBuffs == 0));
        iVar1 = Mio_LibraryHasProfile(pLib);
        if (iVar1 != 0) {
          pMVar3 = (Mio_Library_t *)Abc_FrameReadLibGen();
          Mio_LibraryTransferProfile2(pMVar3,pLib);
        }
        Map_ManFree(p_00);
        if (pNtkNew != (Abc_Ntk_t *)0x0) {
          pNtk_00 = pNtk->pExdc;
          if (pNtk_00 != (Abc_Ntk_t *)0x0) {
            pAVar10 = Abc_NtkDup(pNtk_00);
            pNtkNew->pExdc = pAVar10;
          }
          if (fVerbose != 0) {
            Abc_Print((int)pNtk_00,"%s =","Total runtime");
            level = 3;
            iVar1 = clock_gettime(3,&local_40);
            if (iVar1 < 0) {
              lVar13 = -1;
            }
            else {
              lVar13 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
            }
            Abc_Print(level,"%9.2f sec\n",(double)(lVar13 + lVar12) / 1000000.0);
          }
          iVar1 = Abc_NtkCheck(pNtkNew);
          if (iVar1 != 0) {
            return pNtkNew;
          }
          puts("Abc_NtkMap: The network check has failed.");
          Abc_NtkDelete(pNtkNew);
        }
      }
    }
  }
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Abc_NtkMap( Abc_Ntk_t * pNtk, double DelayTarget, double AreaMulti, double DelayMulti, float LogFan, float Slew, float Gain, int nGatesMin, int fRecovery, int fSwitching, int fSkipFanout, int fUseProfile, int fUseBuffs, int fVerbose )
{
    static int fUseMulti = 0;
    int fShowSwitching = 1;
    Abc_Ntk_t * pNtkNew;
    Map_Man_t * pMan;
    Vec_Int_t * vSwitching = NULL;
    float * pSwitching = NULL;
    abctime clk, clkTotal = Abc_Clock();
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();

    assert( Abc_NtkIsStrash(pNtk) );
    // derive library from SCL
    // if the library is created here, it will be deleted when pSuperLib is deleted in Map_SuperLibFree()
    if ( Abc_FrameReadLibScl() && Abc_SclHasDelayInfo( Abc_FrameReadLibScl() ) )
    {
        if ( pLib && Mio_LibraryHasProfile(pLib) )
            pLib = Abc_SclDeriveGenlib( Abc_FrameReadLibScl(), pLib, Slew, Gain, nGatesMin, fVerbose );
        else
            pLib = Abc_SclDeriveGenlib( Abc_FrameReadLibScl(), NULL, Slew, Gain, nGatesMin, fVerbose );
        if ( Abc_FrameReadLibGen() )
        {
            Mio_LibraryTransferDelays( (Mio_Library_t *)Abc_FrameReadLibGen(), pLib );
            Mio_LibraryTransferProfile( pLib, (Mio_Library_t *)Abc_FrameReadLibGen() );
        }
        // remove supergate library
        Map_SuperLibFree( (Map_SuperLib_t *)Abc_FrameReadLibSuper() );
        Abc_FrameSetLibSuper( NULL );
    }
    // quit if there is no library
    if ( pLib == NULL )
    {
        printf( "The current library is not available.\n" );
        return 0;
    }
    if ( AreaMulti != 0.0 )
        fUseMulti = 1, printf( "The cell areas are multiplied by the factor: <num_fanins> ^ (%.2f).\n", AreaMulti );
    if ( DelayMulti != 0.0 )
        fUseMulti = 1, printf( "The cell delays are multiplied by the factor: <num_fanins> ^ (%.2f).\n", DelayMulti );

    // penalize large gates by increasing their area
    if ( AreaMulti != 0.0 )
        Mio_LibraryMultiArea( pLib, AreaMulti );
    if ( DelayMulti != 0.0 )
        Mio_LibraryMultiDelay( pLib, DelayMulti );

    // derive the supergate library
    if ( fUseMulti || Abc_FrameReadLibSuper() == NULL )
    {
        if ( fVerbose )
            printf( "Converting \"%s\" into supergate library \"%s\".\n", 
                Mio_LibraryReadName(pLib), Extra_FileNameGenericAppend(Mio_LibraryReadName(pLib), ".super") );
        // compute supergate library to be used for mapping
        if ( Mio_LibraryHasProfile(pLib) )
            printf( "Abc_NtkMap(): Genlib library has profile.\n" );
        Map_SuperLibDeriveFromGenlib( pLib, fVerbose );
    }

    // return the library to normal
    if ( AreaMulti != 0.0 )
        Mio_LibraryMultiArea( (Mio_Library_t *)Abc_FrameReadLibGen(), -AreaMulti );
    if ( DelayMulti != 0.0 )
        Mio_LibraryMultiDelay( (Mio_Library_t *)Abc_FrameReadLibGen(), -DelayMulti );

    // print a warning about choice nodes
    if ( fVerbose && Abc_NtkGetChoiceNum( pNtk ) )
        printf( "Performing mapping with choices.\n" );

    // compute switching activity
    fShowSwitching |= fSwitching;
    if ( fShowSwitching )
    {
        extern Vec_Int_t * Sim_NtkComputeSwitching( Abc_Ntk_t * pNtk, int nPatterns );
        vSwitching = Sim_NtkComputeSwitching( pNtk, 4096 );
        pSwitching = (float *)vSwitching->pArray;
    }

    // perform the mapping
    pMan = Abc_NtkToMap( pNtk, DelayTarget, fRecovery, pSwitching, fVerbose );
    if ( pSwitching ) Vec_IntFree( vSwitching );
    if ( pMan == NULL )
        return NULL;
clk = Abc_Clock();
    Map_ManSetSwitching( pMan, fSwitching );
    Map_ManSetSkipFanout( pMan, fSkipFanout );
    if ( fUseProfile )
        Map_ManSetUseProfile( pMan );
    if ( LogFan != 0 )
        Map_ManCreateNodeDelays( pMan, LogFan );
    if ( !Map_Mapping( pMan ) )
    {
        Map_ManFree( pMan );
        return NULL;
    }
//    Map_ManPrintStatsToFile( pNtk->pSpec, Map_ManReadAreaFinal(pMan), Map_ManReadRequiredGlo(pMan), Abc_Clock()-clk );

    // reconstruct the network after mapping (use buffers when user requested or in the area mode)
    pNtkNew = Abc_NtkFromMap( pMan, pNtk, fUseBuffs || (DelayTarget == (double)ABC_INFINITY) );
    if ( Mio_LibraryHasProfile(pLib) )
        Mio_LibraryTransferProfile2( (Mio_Library_t *)Abc_FrameReadLibGen(), pLib );
    Map_ManFree( pMan );
    if ( pNtkNew == NULL )
        return NULL;

    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
if ( fVerbose )
{
ABC_PRT( "Total runtime", Abc_Clock() - clkTotal );
}

    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkMap: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}